

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

void __thiscall
Game::Game(Game *this,unique_ptr<Player,_std::default_delete<Player>_> *white_player,
          unique_ptr<Player,_std::default_delete<Player>_> *black_player,bool walk_through,
          string *pre_turns)

{
  string *pre_turns_local;
  bool walk_through_local;
  unique_ptr<Player,_std::default_delete<Player>_> *black_player_local;
  unique_ptr<Player,_std::default_delete<Player>_> *white_player_local;
  Game *this_local;
  
  this->m_walk_through = walk_through;
  std::vector<std::tuple<Point,_Point,_char>,_std::allocator<std::tuple<Point,_Point,_char>_>_>::
  vector(&this->m_pre_turns);
  Board::Board(&this->m_board);
  this->m_turn = 0;
  std::vector<std::tuple<Point,_Point,_char>,_std::allocator<std::tuple<Point,_Point,_char>_>_>::
  vector(&this->m_turns);
  std::unique_ptr<Player,_std::default_delete<Player>_>::unique_ptr
            (&this->m_white_player,white_player);
  std::unique_ptr<Player,_std::default_delete<Player>_>::unique_ptr
            (&this->m_black_player,black_player);
  setup_turns(this,pre_turns);
  return;
}

Assistant:

Game::Game(unique_ptr<Player> white_player, unique_ptr<Player> black_player, bool walk_through, const string &pre_turns)
        : m_white_player(move(white_player)), m_black_player(move(black_player)), m_walk_through(walk_through),
          m_board(), m_turn(0) {
    setup_turns(pre_turns);
}